

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::GraphicsCacheTestInstance::GraphicsCacheTestInstance
          (GraphicsCacheTestInstance *this,Context *context,CacheTestParam *param)

{
  VkFormat VVar1;
  Context *pCVar2;
  deUint64 dVar3;
  VkRenderPass renderPass;
  VkPipelineCache cache;
  RefData<vk::Handle<(vk::HandleType)8>_> data;
  RefData<vk::Handle<(vk::HandleType)17>_> data_00;
  RefData<vk::Handle<(vk::HandleType)9>_> data_01;
  RefData<vk::Handle<(vk::HandleType)9>_> data_02;
  RefData<vk::Handle<(vk::HandleType)9>_> data_03;
  RefData<vk::Handle<(vk::HandleType)13>_> data_04;
  RefData<vk::Handle<(vk::HandleType)13>_> data_05;
  RefData<vk::Handle<(vk::HandleType)13>_> data_06;
  RefData<vk::Handle<(vk::HandleType)23>_> data_07;
  RefData<vk::Handle<(vk::HandleType)23>_> data_08;
  RefData<vk::Handle<(vk::HandleType)16>_> data_09;
  RefData<vk::Handle<(vk::HandleType)18>_> data_10;
  RefData<vk::Handle<(vk::HandleType)18>_> data_11;
  VkDevice device;
  VkDevice vkd;
  uint uVar4;
  uint uVar5;
  deUint32 dVar6;
  VkShaderStageFlagBits VVar7;
  Allocation *pAVar8;
  void *dst;
  Vertex4RGBA *src;
  size_type sVar9;
  VkDeviceMemory memory;
  VkDeviceSize offset;
  Handle<(vk::HandleType)9> *pHVar10;
  Handle<(vk::HandleType)13> *pHVar11;
  Handle<(vk::HandleType)17> *pHVar12;
  VkPhysicalDeviceFeatures *__src;
  NotSupportedError *pNVar13;
  Handle<(vk::HandleType)15> *pHVar14;
  Handle<(vk::HandleType)16> *pHVar15;
  Move<vk::Handle<(vk::HandleType)18>_> *local_8a8;
  Move<vk::Handle<(vk::HandleType)23>_> *local_888;
  Move<vk::Handle<(vk::HandleType)13>_> *local_868;
  Move<vk::Handle<(vk::HandleType)9>_> *local_848;
  VkImageMemoryBarrier *local_808;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_7e0;
  Vector<unsigned_int,_2> local_7a0;
  Move<vk::Handle<(vk::HandleType)18>_> local_798;
  RefData<vk::Handle<(vk::HandleType)18>_> local_778;
  deUint64 local_758;
  VkPipelineCache local_750;
  VkRenderPass local_748;
  Vector<unsigned_int,_2> local_740;
  Move<vk::Handle<(vk::HandleType)18>_> local_738;
  RefData<vk::Handle<(vk::HandleType)18>_> local_718;
  Move<vk::Handle<(vk::HandleType)16>_> local_6f8;
  RefData<vk::Handle<(vk::HandleType)16>_> local_6d8;
  undefined1 auStack_6b8 [8];
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  deUint32 shaderNdx;
  VkPhysicalDeviceFeatures features;
  RefData<vk::Handle<(vk::HandleType)23>_> local_588;
  Move<vk::Handle<(vk::HandleType)23>_> local_568;
  RefData<vk::Handle<(vk::HandleType)23>_> local_548;
  undefined1 local_528 [8];
  VkFramebufferCreateInfo framebufferParams;
  VkImageView attachmentBindInfos [2];
  RefData<vk::Handle<(vk::HandleType)13>_> local_4b8;
  undefined1 local_498 [8];
  VkImageViewCreateInfo depthAttachmentViewParams;
  RefData<vk::Handle<(vk::HandleType)13>_> local_428;
  Move<vk::Handle<(vk::HandleType)13>_> local_408;
  RefData<vk::Handle<(vk::HandleType)13>_> local_3e8;
  undefined1 local_3c8 [8];
  VkImageViewCreateInfo colorAttachmentViewParams;
  VkImageMemoryBarrier depthImageBarrier;
  VkImageMemoryBarrier colorImageBarrier;
  RefData<vk::Handle<(vk::HandleType)9>_> local_2c8;
  Move<vk::Handle<(vk::HandleType)9>_> local_2a8;
  RefData<vk::Handle<(vk::HandleType)9>_> local_288;
  Move<vk::Handle<(vk::HandleType)9>_> local_268;
  RefData<vk::Handle<(vk::HandleType)9>_> local_248;
  undefined8 uStack_228;
  VkComponentMapping ComponentMappingRGBA;
  Move<vk::Handle<(vk::HandleType)17>_> local_210;
  RefData<vk::Handle<(vk::HandleType)17>_> local_1f0;
  undefined1 local_1d0 [8];
  VkRenderPassCreateInfo renderPassParams;
  VkSubpassDescription subpassDescription;
  VkAttachmentReference depthAttachmentReference;
  VkAttachmentReference colorAttachmentReference;
  VkAttachmentDescription attachments [2];
  VkAttachmentDescription depthAttachmentDescription;
  VkAttachmentDescription colorAttachmentDescription;
  vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_> local_98;
  Move<vk::Handle<(vk::HandleType)8>_> local_80;
  RefData<vk::Handle<(vk::HandleType)8>_> local_60;
  VkDevice local_40;
  VkDevice vkDevice;
  DeviceInterface *vk;
  CacheTestParam *local_20;
  CacheTestParam *param_local;
  Context *context_local;
  GraphicsCacheTestInstance *this_local;
  
  local_20 = param;
  param_local = (CacheTestParam *)context;
  context_local = (Context *)this;
  CacheTestInstance::CacheTestInstance(&this->super_CacheTestInstance,context,param);
  (this->super_CacheTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__GraphicsCacheTestInstance_0165fb00;
  tcu::Vector<unsigned_int,_2>::Vector(&this->m_renderSize,0x20,0x20);
  this->m_colorFormat = VK_FORMAT_R8G8B8A8_UNORM;
  this->m_depthFormat = VK_FORMAT_D16_UNORM;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::Move(&this->m_pipelineLayout);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(&this->m_depthImage);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_depthImageAlloc);
  local_7e0 = this->m_colorImageAlloc;
  do {
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr(local_7e0);
    local_7e0 = local_7e0 + 1;
  } while ((Move<vk::Handle<(vk::HandleType)13>_> *)local_7e0 != &this->m_depthAttachmentView);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(&this->m_depthAttachmentView);
  local_808 = this->m_imageLayoutBarriers;
  do {
    ::vk::VkImageMemoryBarrier::VkImageMemoryBarrier(local_808);
    local_808 = local_808 + 1;
  } while (local_808 != (VkImageMemoryBarrier *)&this->m_vertexBuffer);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::Move(&this->m_vertexBuffer);
  de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::MovePtr
            (&this->m_vertexBufferMemory);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::vector
            (&this->m_vertices);
  SimpleGraphicsPipelineBuilder::SimpleGraphicsPipelineBuilder
            ((SimpleGraphicsPipelineBuilder *)&this->m_pipelineBuilder,(Context *)param_local);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::Move(&this->m_renderPass);
  local_848 = this->m_colorImage;
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::Move(local_848);
    local_848 = local_848 + 1;
  } while ((Move<vk::Handle<(vk::HandleType)13>_> *)local_848 != this->m_colorAttachmentView);
  local_868 = this->m_colorAttachmentView;
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::Move(local_868);
    local_868 = local_868 + 1;
  } while (local_868 != (Move<vk::Handle<(vk::HandleType)13>_> *)this->m_framebuffer);
  local_888 = this->m_framebuffer;
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::Move(local_888);
    local_888 = local_888 + 1;
  } while ((Move<vk::Handle<(vk::HandleType)18>_> *)local_888 != this->m_pipeline);
  local_8a8 = this->m_pipeline;
  do {
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::Move(local_8a8);
    local_8a8 = local_8a8 + 1;
  } while ((GraphicsCacheTestInstance *)local_8a8 != this + 1);
  vkDevice = (VkDevice)
             Context::getDeviceInterface
                       ((this->super_CacheTestInstance).super_TestInstance.m_context);
  local_40 = Context::getDevice((this->super_CacheTestInstance).super_TestInstance.m_context);
  createBufferAndBindMemory
            (&local_80,(this->super_CacheTestInstance).super_TestInstance.m_context,0x400,0x80,
             &this->m_vertexBufferMemory);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_60,(Move *)&local_80);
  data.deleter.m_deviceIface = local_60.deleter.m_deviceIface;
  data.object.m_internal = local_60.object.m_internal;
  data.deleter.m_device = local_60.deleter.m_device;
  data.deleter.m_allocator = local_60.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::operator=(&this->m_vertexBuffer,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move(&local_80);
  createOverlappingQuads();
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::operator=
            (&this->m_vertices,&local_98);
  std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::~vector
            (&local_98);
  pAVar8 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_vertexBufferMemory).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  dst = ::vk::Allocation::getHostPtr(pAVar8);
  src = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::data
                  (&this->m_vertices);
  sVar9 = std::vector<vkt::pipeline::Vertex4RGBA,_std::allocator<vkt::pipeline::Vertex4RGBA>_>::size
                    (&this->m_vertices);
  ::deMemcpy(dst,src,sVar9 << 5);
  vkd = vkDevice;
  device = local_40;
  pAVar8 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_vertexBufferMemory).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  memory = ::vk::Allocation::getMemory(pAVar8);
  pAVar8 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::operator->
                     (&(this->m_vertexBufferMemory).
                       super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>);
  offset = ::vk::Allocation::getOffset(pAVar8);
  ::vk::flushMappedMemoryRange((DeviceInterface *)vkd,device,memory,offset,0x400);
  colorAttachmentReference = (VkAttachmentReference)((ulong)this->m_colorFormat << 0x20);
  depthAttachmentReference.attachment = 0;
  depthAttachmentReference.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  subpassDescription.pPreserveAttachments = (deUint32 *)0x300000001;
  renderPassParams.pDependencies._0_4_ = 0;
  renderPassParams.pDependencies._4_4_ = 0;
  subpassDescription.flags = 0;
  subpassDescription.inputAttachmentCount = 0;
  subpassDescription._12_4_ = 0;
  subpassDescription.pInputAttachments._0_4_ = 1;
  subpassDescription._24_8_ = &depthAttachmentReference;
  subpassDescription.pColorAttachments = (VkAttachmentReference *)0x0;
  subpassDescription.pResolveAttachments =
       (VkAttachmentReference *)&subpassDescription.pPreserveAttachments;
  subpassDescription.pDepthStencilAttachment._0_4_ = 0;
  subpassDescription.preserveAttachmentCount = 0;
  subpassDescription._60_4_ = 0;
  local_1d0._0_4_ = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  renderPassParams._4_4_ = 0;
  renderPassParams.pNext._0_4_ = 0;
  renderPassParams.pNext._4_4_ = 2;
  renderPassParams._16_8_ = &colorAttachmentReference;
  renderPassParams.pAttachments._0_4_ = 1;
  renderPassParams._32_8_ = &renderPassParams.pDependencies;
  renderPassParams.pSubpasses._0_4_ = 0;
  renderPassParams.dependencyCount = 0;
  renderPassParams._52_4_ = 0;
  ::vk::createRenderPass
            (&local_210,(DeviceInterface *)vkDevice,local_40,(VkRenderPassCreateInfo *)local_1d0,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1f0,(Move *)&local_210);
  data_00.deleter.m_deviceIface = local_1f0.deleter.m_deviceIface;
  data_00.object.m_internal = local_1f0.object.m_internal;
  data_00.deleter.m_device = local_1f0.deleter.m_device;
  data_00.deleter.m_allocator = local_1f0.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::operator=(&this->m_renderPass,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move(&local_210);
  uStack_228._0_4_ = VK_IMAGE_VIEW_TYPE_CUBE;
  uStack_228._4_4_ = VK_FORMAT_R5G6B5_UNORM_PACK16;
  ComponentMappingRGBA.r = VK_COMPONENT_SWIZZLE_B;
  ComponentMappingRGBA.g = VK_COMPONENT_SWIZZLE_A;
  pCVar2 = (this->super_CacheTestInstance).super_TestInstance.m_context;
  VVar1 = this->m_colorFormat;
  uVar4 = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  uVar5 = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  createImage2DAndBindMemory
            (&local_268,pCVar2,VVar1,uVar4,uVar5,0x11,VK_SAMPLE_COUNT_1_BIT,this->m_colorImageAlloc)
  ;
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_248,(Move *)&local_268);
  data_01.deleter.m_deviceIface = local_248.deleter.m_deviceIface;
  data_01.object.m_internal = local_248.object.m_internal;
  data_01.deleter.m_device = local_248.deleter.m_device;
  data_01.deleter.m_allocator = local_248.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=(this->m_colorImage,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_268);
  pCVar2 = (this->super_CacheTestInstance).super_TestInstance.m_context;
  VVar1 = this->m_colorFormat;
  uVar4 = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  uVar5 = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  createImage2DAndBindMemory
            (&local_2a8,pCVar2,VVar1,uVar4,uVar5,0x11,VK_SAMPLE_COUNT_1_BIT,
             this->m_colorImageAlloc + 1);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_288,(Move *)&local_2a8);
  data_02.deleter.m_deviceIface = local_288.deleter.m_deviceIface;
  data_02.object.m_internal = local_288.object.m_internal;
  data_02.deleter.m_device = local_288.deleter.m_device;
  data_02.deleter.m_allocator = local_288.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=(this->m_colorImage + 1,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move(&local_2a8);
  pCVar2 = (this->super_CacheTestInstance).super_TestInstance.m_context;
  VVar1 = this->m_depthFormat;
  uVar4 = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  uVar5 = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  createImage2DAndBindMemory
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&colorImageBarrier.subresourceRange.layerCount,
             pCVar2,VVar1,uVar4,uVar5,0x20,VK_SAMPLE_COUNT_1_BIT,&this->m_depthImageAlloc);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_2c8,(Move *)&colorImageBarrier.subresourceRange.layerCount);
  data_03.deleter.m_deviceIface = local_2c8.deleter.m_deviceIface;
  data_03.object.m_internal = local_2c8.object.m_internal;
  data_03.deleter.m_device = local_2c8.deleter.m_device;
  data_03.deleter.m_allocator = local_2c8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::operator=(&this->m_depthImage,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)9>_> *)&colorImageBarrier.subresourceRange.layerCount)
  ;
  colorImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorImageBarrier._4_4_ = 0;
  colorImageBarrier.pNext._0_4_ = 0;
  colorImageBarrier.pNext._4_4_ = 0x100;
  colorImageBarrier.srcAccessMask = 0;
  colorImageBarrier.dstAccessMask = 2;
  colorImageBarrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  colorImageBarrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  colorImageBarrier._32_8_ = pHVar10->m_internal;
  colorImageBarrier.image.m_internal._0_4_ = 1;
  colorImageBarrier.image.m_internal._4_4_ = 0;
  colorImageBarrier.subresourceRange.aspectMask = 1;
  colorImageBarrier.subresourceRange.baseMipLevel = 0;
  colorImageBarrier.subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[0].subresourceRange.layerCount = 1;
  this->m_imageLayoutBarriers[0].subresourceRange.aspectMask = 1;
  this->m_imageLayoutBarriers[0].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[0].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[0].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[0].srcQueueFamilyIndex = colorImageBarrier.oldLayout;
  this->m_imageLayoutBarriers[0].dstQueueFamilyIndex = colorImageBarrier.newLayout;
  this->m_imageLayoutBarriers[0].image.m_internal = colorImageBarrier._32_8_;
  this->m_imageLayoutBarriers[0].srcAccessMask = colorImageBarrier.pNext._0_4_;
  this->m_imageLayoutBarriers[0].dstAccessMask = colorImageBarrier.pNext._4_4_;
  this->m_imageLayoutBarriers[0].oldLayout = colorImageBarrier.srcAccessMask;
  this->m_imageLayoutBarriers[0].newLayout = colorImageBarrier.dstAccessMask;
  *(ulong *)this->m_imageLayoutBarriers = CONCAT44(depthImageBarrier._68_4_,0x2d);
  this->m_imageLayoutBarriers[0].pNext = (void *)colorImageBarrier._0_8_;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  colorImageBarrier._32_8_ = pHVar10->m_internal;
  this->m_imageLayoutBarriers[1].subresourceRange.layerCount =
       colorImageBarrier.subresourceRange.levelCount;
  this->m_imageLayoutBarriers[1].subresourceRange.aspectMask =
       (undefined4)colorImageBarrier.image.m_internal;
  this->m_imageLayoutBarriers[1].subresourceRange.baseMipLevel =
       colorImageBarrier.image.m_internal._4_4_;
  this->m_imageLayoutBarriers[1].subresourceRange.levelCount =
       colorImageBarrier.subresourceRange.aspectMask;
  this->m_imageLayoutBarriers[1].subresourceRange.baseArrayLayer =
       colorImageBarrier.subresourceRange.baseMipLevel;
  this->m_imageLayoutBarriers[1].srcQueueFamilyIndex = colorImageBarrier.oldLayout;
  this->m_imageLayoutBarriers[1].dstQueueFamilyIndex = colorImageBarrier.newLayout;
  this->m_imageLayoutBarriers[1].image.m_internal = colorImageBarrier._32_8_;
  this->m_imageLayoutBarriers[1].srcAccessMask = colorImageBarrier.pNext._0_4_;
  this->m_imageLayoutBarriers[1].dstAccessMask = colorImageBarrier.pNext._4_4_;
  this->m_imageLayoutBarriers[1].oldLayout = colorImageBarrier.srcAccessMask;
  this->m_imageLayoutBarriers[1].newLayout = colorImageBarrier.dstAccessMask;
  *(ulong *)(this->m_imageLayoutBarriers + 1) = CONCAT44(depthImageBarrier._68_4_,0x2d);
  this->m_imageLayoutBarriers[1].pNext = (void *)colorImageBarrier._0_8_;
  colorAttachmentViewParams.subresourceRange.layerCount = 0x2d;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&(this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  dVar3 = pHVar10->m_internal;
  this->m_imageLayoutBarriers[2].subresourceRange.layerCount = 1;
  this->m_imageLayoutBarriers[2].subresourceRange.aspectMask = 2;
  this->m_imageLayoutBarriers[2].subresourceRange.baseMipLevel = 0;
  this->m_imageLayoutBarriers[2].subresourceRange.levelCount = 1;
  this->m_imageLayoutBarriers[2].subresourceRange.baseArrayLayer = 0;
  this->m_imageLayoutBarriers[2].srcQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[2].dstQueueFamilyIndex = 0xffffffff;
  this->m_imageLayoutBarriers[2].image.m_internal = dVar3;
  this->m_imageLayoutBarriers[2].srcAccessMask = 0;
  this->m_imageLayoutBarriers[2].dstAccessMask = 0x400;
  this->m_imageLayoutBarriers[2].oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  this->m_imageLayoutBarriers[2].newLayout = VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL;
  *(ulong *)(this->m_imageLayoutBarriers + 2) =
       CONCAT44(colorAttachmentViewParams._76_4_,
                colorAttachmentViewParams.subresourceRange.layerCount);
  this->m_imageLayoutBarriers[2].pNext = (void *)0x0;
  local_3c8._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  colorAttachmentViewParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  colorAttachmentViewParams._4_4_ = 0;
  colorAttachmentViewParams.pNext._0_4_ = 0;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&this->m_colorImage[0].super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  colorAttachmentViewParams._16_8_ = pHVar10->m_internal;
  colorAttachmentViewParams.image.m_internal._0_4_ = 1;
  colorAttachmentViewParams.image.m_internal._4_4_ = this->m_colorFormat;
  colorAttachmentViewParams.viewType = (VkImageViewType)uStack_228;
  colorAttachmentViewParams.format = uStack_228._4_4_;
  colorAttachmentViewParams.components.r = ComponentMappingRGBA.r;
  colorAttachmentViewParams.components.g = ComponentMappingRGBA.g;
  colorAttachmentViewParams.components.b = VK_COMPONENT_SWIZZLE_ZERO;
  colorAttachmentViewParams.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  colorAttachmentViewParams.subresourceRange.aspectMask = 1;
  colorAttachmentViewParams.subresourceRange.baseMipLevel = 0;
  colorAttachmentViewParams.subresourceRange.levelCount = 1;
  ::vk::createImageView
            (&local_408,(DeviceInterface *)vkDevice,local_40,(VkImageViewCreateInfo *)local_3c8,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_3e8,(Move *)&local_408);
  data_04.deleter.m_deviceIface = local_3e8.deleter.m_deviceIface;
  data_04.object.m_internal = local_3e8.object.m_internal;
  data_04.deleter.m_device = local_3e8.deleter.m_device;
  data_04.deleter.m_allocator = local_3e8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
            (this->m_colorAttachmentView,data_04);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_408);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&this->m_colorImage[1].super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  colorAttachmentViewParams._16_8_ = pHVar10->m_internal;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)
             &depthAttachmentViewParams.subresourceRange.layerCount,(DeviceInterface *)vkDevice,
             local_40,(VkImageViewCreateInfo *)local_3c8,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_428,(Move *)&depthAttachmentViewParams.subresourceRange.layerCount);
  data_05.deleter.m_deviceIface = local_428.deleter.m_deviceIface;
  data_05.object.m_internal = local_428.object.m_internal;
  data_05.deleter.m_device = local_428.deleter.m_device;
  data_05.deleter.m_allocator = local_428.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
            (this->m_colorAttachmentView + 1,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)
             &depthAttachmentViewParams.subresourceRange.layerCount);
  local_498._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  depthAttachmentViewParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  depthAttachmentViewParams._4_4_ = 0;
  depthAttachmentViewParams.pNext._0_4_ = 0;
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                      (&(this->m_depthImage).super_RefBase<vk::Handle<(vk::HandleType)9>_>);
  depthAttachmentViewParams._16_8_ = pHVar10->m_internal;
  depthAttachmentViewParams.image.m_internal._0_4_ = 1;
  depthAttachmentViewParams.image.m_internal._4_4_ = this->m_depthFormat;
  depthAttachmentViewParams.viewType = (VkImageViewType)uStack_228;
  depthAttachmentViewParams.format = uStack_228._4_4_;
  depthAttachmentViewParams.components.r = ComponentMappingRGBA.r;
  depthAttachmentViewParams.components.g = ComponentMappingRGBA.g;
  depthAttachmentViewParams.components.b = VK_COMPONENT_SWIZZLE_ONE;
  depthAttachmentViewParams.components.a = VK_COMPONENT_SWIZZLE_IDENTITY;
  depthAttachmentViewParams.subresourceRange.aspectMask = 1;
  depthAttachmentViewParams.subresourceRange.baseMipLevel = 0;
  depthAttachmentViewParams.subresourceRange.levelCount = 1;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)(attachmentBindInfos + 1),
             (DeviceInterface *)vkDevice,local_40,(VkImageViewCreateInfo *)local_498,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_4b8,(Move *)(attachmentBindInfos + 1));
  data_06.deleter.m_deviceIface = local_4b8.deleter.m_deviceIface;
  data_06.object.m_internal = local_4b8.object.m_internal;
  data_06.deleter.m_device = local_4b8.deleter.m_device;
  data_06.deleter.m_allocator = local_4b8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::operator=
            (&this->m_depthAttachmentView,data_06);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)13>_> *)(attachmentBindInfos + 1));
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      (&this->m_colorAttachmentView[0].
                        super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  framebufferParams._56_8_ = pHVar11->m_internal;
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      (&(this->m_depthAttachmentView).super_RefBase<vk::Handle<(vk::HandleType)13>_>
                      );
  attachmentBindInfos[0].m_internal = pHVar11->m_internal;
  local_528._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  framebufferParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  framebufferParams._4_4_ = 0;
  framebufferParams.pNext._0_4_ = 0;
  pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  framebufferParams._16_8_ = pHVar12->m_internal;
  framebufferParams.renderPass.m_internal._0_4_ = 2;
  framebufferParams._32_8_ = &framebufferParams.layers;
  framebufferParams.pAttachments._0_4_ = tcu::Vector<unsigned_int,_2>::x(&this->m_renderSize);
  framebufferParams.pAttachments._4_4_ = tcu::Vector<unsigned_int,_2>::y(&this->m_renderSize);
  framebufferParams.width = 1;
  ::vk::createFramebuffer
            (&local_568,(DeviceInterface *)vkDevice,local_40,(VkFramebufferCreateInfo *)local_528,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_548,(Move *)&local_568);
  data_07.deleter.m_deviceIface = local_548.deleter.m_deviceIface;
  data_07.object.m_internal = local_548.object.m_internal;
  data_07.deleter.m_device = local_548.deleter.m_device;
  data_07.deleter.m_allocator = local_548.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=(this->m_framebuffer,data_07);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_568);
  pHVar11 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      (&this->m_colorAttachmentView[1].
                        super_RefBase<vk::Handle<(vk::HandleType)13>_>);
  framebufferParams._56_8_ = pHVar11->m_internal;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&features.variableMultisampleRate,
             (DeviceInterface *)vkDevice,local_40,(VkFramebufferCreateInfo *)local_528,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_588,(Move *)&features.variableMultisampleRate);
  data_08.deleter.m_deviceIface = local_588.deleter.m_deviceIface;
  data_08.object.m_internal = local_588.object.m_internal;
  data_08.deleter.m_device = local_588.deleter.m_device;
  data_08.deleter.m_allocator = local_588.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::operator=
            (this->m_framebuffer + 1,data_08);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&features.variableMultisampleRate);
  __src = Context::getDeviceFeatures((this->super_CacheTestInstance).super_TestInstance.m_context);
  memcpy((void *)((long)&pipelineLayoutParams.pPushConstantRanges + 4),__src,0xdc);
  pipelineLayoutParams.pPushConstantRanges._0_4_ = 0;
  do {
    uVar4 = (uint)pipelineLayoutParams.pPushConstantRanges;
    dVar6 = CacheTestParam::getShaderCount((this->super_CacheTestInstance).m_param);
    if (dVar6 <= uVar4) {
      pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)0x0;
      pipelineLayoutParams.pushConstantRangeCount = 0;
      pipelineLayoutParams._36_4_ = 0;
      pipelineLayoutParams.pNext = (void *)0x0;
      pipelineLayoutParams.flags = 0;
      pipelineLayoutParams.setLayoutCount = 0;
      pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      pipelineLayoutParams._4_4_ = 0;
      auStack_6b8 = (undefined1  [8])0x1e;
      ::vk::createPipelineLayout
                (&local_6f8,(DeviceInterface *)vkDevice,local_40,
                 (VkPipelineLayoutCreateInfo *)auStack_6b8,(VkAllocationCallbacks *)0x0);
      ::vk::refdetails::Move::operator_cast_to_RefData(&local_6d8,(Move *)&local_6f8);
      data_09.deleter.m_deviceIface = local_6d8.deleter.m_deviceIface;
      data_09.object.m_internal = local_6d8.object.m_internal;
      data_09.deleter.m_device = local_6d8.deleter.m_device;
      data_09.deleter.m_allocator = local_6d8.deleter.m_allocator;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::operator=
                (&this->m_pipelineLayout,data_09);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move(&local_6f8);
      tcu::Vector<unsigned_int,_2>::Vector(&local_740,&this->m_renderSize);
      pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                          (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
      local_748.m_internal = pHVar12->m_internal;
      pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                          (&(this->super_CacheTestInstance).m_cache.
                            super_RefBase<vk::Handle<(vk::HandleType)15>_>);
      local_750.m_internal = pHVar14->m_internal;
      pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                          (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>)
      ;
      local_758 = pHVar15->m_internal;
      SimpleGraphicsPipelineBuilder::buildPipeline
                (&local_738,(SimpleGraphicsPipelineBuilder *)&this->m_pipelineBuilder,&local_740,
                 local_748,local_750,(VkPipelineLayout)local_758);
      ::vk::refdetails::Move::operator_cast_to_RefData(&local_718,(Move *)&local_738);
      data_10.deleter.m_deviceIface = local_718.deleter.m_deviceIface;
      data_10.object.m_internal = local_718.object.m_internal;
      data_10.deleter.m_device = local_718.deleter.m_device;
      data_10.deleter.m_allocator = local_718.deleter.m_allocator;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=(this->m_pipeline,data_10);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_738);
      tcu::Vector<unsigned_int,_2>::Vector(&local_7a0,&this->m_renderSize);
      pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                          (&(this->m_renderPass).super_RefBase<vk::Handle<(vk::HandleType)17>_>);
      renderPass.m_internal = pHVar12->m_internal;
      pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                          (&(this->super_CacheTestInstance).m_cache.
                            super_RefBase<vk::Handle<(vk::HandleType)15>_>);
      cache.m_internal = pHVar14->m_internal;
      pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                          (&(this->m_pipelineLayout).super_RefBase<vk::Handle<(vk::HandleType)16>_>)
      ;
      SimpleGraphicsPipelineBuilder::buildPipeline
                (&local_798,(SimpleGraphicsPipelineBuilder *)&this->m_pipelineBuilder,&local_7a0,
                 renderPass,cache,(VkPipelineLayout)pHVar15->m_internal);
      ::vk::refdetails::Move::operator_cast_to_RefData(&local_778,(Move *)&local_798);
      data_11.deleter.m_deviceIface = local_778.deleter.m_deviceIface;
      data_11.object.m_internal = local_778.object.m_internal;
      data_11.deleter.m_device = local_778.deleter.m_device;
      data_11.deleter.m_allocator = local_778.deleter.m_allocator;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=
                (this->m_pipeline + 1,data_11);
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_798);
      return;
    }
    VVar7 = CacheTestParam::getShaderFlag
                      ((this->super_CacheTestInstance).m_param,
                       (uint)pipelineLayoutParams.pPushConstantRanges);
    switch(VVar7) {
    case VK_SHADER_STAGE_VERTEX_BIT:
      SimpleGraphicsPipelineBuilder::bindShaderStage
                ((SimpleGraphicsPipelineBuilder *)&this->m_pipelineBuilder,
                 VK_SHADER_STAGE_VERTEX_BIT,"color_vert","main");
      break;
    case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
      if (features.independentBlend == 0) {
        pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar13,"Tessellation Not Supported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                   ,0x3fe);
        __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      SimpleGraphicsPipelineBuilder::bindShaderStage
                ((SimpleGraphicsPipelineBuilder *)&this->m_pipelineBuilder,
                 VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,"basic_tcs","main");
      SimpleGraphicsPipelineBuilder::enableTessellationStage
                ((SimpleGraphicsPipelineBuilder *)&this->m_pipelineBuilder,3);
      break;
    default:
      break;
    case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
      if (features.independentBlend == 0) {
        pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar13,"Tessellation Not Supported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                   ,0x409);
        __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      SimpleGraphicsPipelineBuilder::bindShaderStage
                ((SimpleGraphicsPipelineBuilder *)&this->m_pipelineBuilder,
                 VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,"basic_tes","main");
      SimpleGraphicsPipelineBuilder::enableTessellationStage
                ((SimpleGraphicsPipelineBuilder *)&this->m_pipelineBuilder,3);
      break;
    case VK_SHADER_STAGE_GEOMETRY_BIT:
      if (features.imageCubeArray == 0) {
        pNVar13 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar13,"Geometry Shader Not Supported",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                   ,0x3f4);
        __cxa_throw(pNVar13,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      SimpleGraphicsPipelineBuilder::bindShaderStage
                ((SimpleGraphicsPipelineBuilder *)&this->m_pipelineBuilder,
                 VK_SHADER_STAGE_GEOMETRY_BIT,"dummy_geo","main");
      break;
    case VK_SHADER_STAGE_FRAGMENT_BIT:
      SimpleGraphicsPipelineBuilder::bindShaderStage
                ((SimpleGraphicsPipelineBuilder *)&this->m_pipelineBuilder,
                 VK_SHADER_STAGE_FRAGMENT_BIT,"color_frag","main");
    }
    pipelineLayoutParams.pPushConstantRanges._0_4_ =
         (uint)pipelineLayoutParams.pPushConstantRanges + 1;
  } while( true );
}

Assistant:

GraphicsCacheTestInstance::GraphicsCacheTestInstance (Context&              context,
													  const CacheTestParam* param)
	: CacheTestInstance (context,param)
	, m_renderSize      (32u, 32u)
	, m_colorFormat     (VK_FORMAT_R8G8B8A8_UNORM)
	, m_depthFormat     (VK_FORMAT_D16_UNORM)
	, m_pipelineBuilder (context)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();

	// Create vertex buffer
	{
		m_vertexBuffer = createBufferAndBindMemory(m_context, 1024u, VK_BUFFER_USAGE_VERTEX_BUFFER_BIT, &m_vertexBufferMemory);

		m_vertices          = createOverlappingQuads();
		// Load vertices into vertex buffer
		deMemcpy(m_vertexBufferMemory->getHostPtr(), m_vertices.data(), m_vertices.size() * sizeof(Vertex4RGBA));
		flushMappedMemoryRange(vk, vkDevice, m_vertexBufferMemory->getMemory(), m_vertexBufferMemory->getOffset(), 1024u);
	}

	// Create render pass
	{
		const VkAttachmentDescription colorAttachmentDescription =
		{
			0u,                                                 // VkAttachmentDescriptionFlags    flags;
			m_colorFormat,                                      // VkFormat                        format;
			VK_SAMPLE_COUNT_1_BIT,                              // VkSampleCountFlagBits           samples;
			VK_ATTACHMENT_LOAD_OP_CLEAR,                        // VkAttachmentLoadOp              loadOp;
			VK_ATTACHMENT_STORE_OP_STORE,                       // VkAttachmentStoreOp             storeOp;
			VK_ATTACHMENT_LOAD_OP_DONT_CARE,                    // VkAttachmentLoadOp              stencilLoadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp             stencilStoreOp;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,           // VkImageLayout                   initialLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,           // VkImageLayout                   finalLayout;
		};

		const VkAttachmentDescription depthAttachmentDescription =
		{
			0u,                                                 // VkAttachmentDescriptionFlags flags;
			m_depthFormat,                                      // VkFormat                     format;
			VK_SAMPLE_COUNT_1_BIT,                              // VkSampleCountFlagBits        samples;
			VK_ATTACHMENT_LOAD_OP_CLEAR,                        // VkAttachmentLoadOp           loadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp          storeOp;
			VK_ATTACHMENT_LOAD_OP_DONT_CARE,                    // VkAttachmentLoadOp           stencilLoadOp;
			VK_ATTACHMENT_STORE_OP_DONT_CARE,                   // VkAttachmentStoreOp          stencilStoreOp;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,   // VkImageLayout                initialLayout;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,   // VkImageLayout                finalLayout;
		};

		const VkAttachmentDescription attachments[2] =
		{
			colorAttachmentDescription,
			depthAttachmentDescription
		};

		const VkAttachmentReference colorAttachmentReference =
		{
			0u,                                                 // deUint32         attachment;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL            // VkImageLayout    layout;
		};

		const VkAttachmentReference depthAttachmentReference =
		{
			1u,                                                 // deUint32         attachment;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL    // VkImageLayout    layout;
		};

		const VkSubpassDescription subpassDescription =
		{
			0u,                                                 // VkSubpassDescriptionFlags        flags;
			VK_PIPELINE_BIND_POINT_GRAPHICS,                    // VkPipelineBindPoint              pipelineBindPoint;
			0u,                                                 // deUint32                         inputAttachmentCount;
			DE_NULL,                                            // const VkAttachmentReference*     pInputAttachments;
			1u,                                                 // deUint32                         colorAttachmentCount;
			&colorAttachmentReference,                          // const VkAttachmentReference*     pColorAttachments;
			DE_NULL,                                            // const VkAttachmentReference*     pResolveAttachments;
			&depthAttachmentReference,                          // const VkAttachmentReference*     pDepthStencilAttachment;
			0u,                                                 // deUint32                         preserveAttachmentCount;
			DE_NULL                                             // const VkAttachmentReference*     pPreserveAttachments;
		};

		const VkRenderPassCreateInfo renderPassParams =
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,          // VkStructureType                  sType;
			DE_NULL,                                            // const void*                      pNext;
			0u,                                                 // VkRenderPassCreateFlags          flags;
			2u,                                                 // deUint32                         attachmentCount;
			attachments,                                        // const VkAttachmentDescription*   pAttachments;
			1u,                                                 // deUint32                         subpassCount;
			&subpassDescription,                                // const VkSubpassDescription*      pSubpasses;
			0u,                                                 // deUint32                         dependencyCount;
			DE_NULL                                             // const VkSubpassDependency*       pDependencies;
		};

		m_renderPass = createRenderPass(vk, vkDevice, &renderPassParams);
	}

	const VkComponentMapping    ComponentMappingRGBA = { VK_COMPONENT_SWIZZLE_R, VK_COMPONENT_SWIZZLE_G, VK_COMPONENT_SWIZZLE_B, VK_COMPONENT_SWIZZLE_A};
	// Create color image
	{
		m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE] = createImage2DAndBindMemory(m_context,
																			   m_colorFormat,
																			   m_renderSize.x(),
																			   m_renderSize.y(),
																			   VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
																			   VK_SAMPLE_COUNT_1_BIT,
																			   &m_colorImageAlloc[PIPELINE_CACHE_NDX_NO_CACHE]);
		m_colorImage[PIPELINE_CACHE_NDX_CACHED]   = createImage2DAndBindMemory(m_context,
																			   m_colorFormat,
																			   m_renderSize.x(),
																			   m_renderSize.y(),
																			   VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT,
																			   VK_SAMPLE_COUNT_1_BIT,
																			   &m_colorImageAlloc[PIPELINE_CACHE_NDX_CACHED]);
	}

	// Create depth image
	{
		m_depthImage = createImage2DAndBindMemory(m_context,
												  m_depthFormat,
												  m_renderSize.x(),
												  m_renderSize.y(),
												  VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT,
												  VK_SAMPLE_COUNT_1_BIT,
												  &m_depthImageAlloc);
	}

	// Set up image layout transition barriers
	{
		VkImageMemoryBarrier colorImageBarrier =
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
			DE_NULL,											// const void*				pNext;
			0u,													// VkAccessFlags			srcAccessMask;
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,				// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,			// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					dstQueueFamilyIndex;
			*m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE],			// VkImage					image;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u },		// VkImageSubresourceRange	subresourceRange;
		};

		m_imageLayoutBarriers[0] = colorImageBarrier;

		colorImageBarrier.image = *m_colorImage[PIPELINE_CACHE_NDX_CACHED];
		m_imageLayoutBarriers[1] = colorImageBarrier;

		const VkImageMemoryBarrier depthImageBarrier =
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,				// VkStructureType			sType;
			DE_NULL,											// const void*				pNext;
			0u,													// VkAccessFlags			srcAccessMask;
			VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT,		// VkAccessFlags			dstAccessMask;
			VK_IMAGE_LAYOUT_UNDEFINED,							// VkImageLayout			oldLayout;
			VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,	// VkImageLayout			newLayout;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					srcQueueFamilyIndex;
			VK_QUEUE_FAMILY_IGNORED,							// deUint32					dstQueueFamilyIndex;
			*m_depthImage,										// VkImage					image;
			{ VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u },		// VkImageSubresourceRange	subresourceRange;
		};

		m_imageLayoutBarriers[2] = depthImageBarrier;
	}
	// Create color attachment view
	{
		VkImageViewCreateInfo colorAttachmentViewParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,       // VkStructureType          sType;
			DE_NULL,                                        // const void*              pNext;
			0u,                                             // VkImageViewCreateFlags   flags;
			*m_colorImage[PIPELINE_CACHE_NDX_NO_CACHE],     // VkImage                  image;
			VK_IMAGE_VIEW_TYPE_2D,                          // VkImageViewType          viewType;
			m_colorFormat,                                  // VkFormat                 format;
			ComponentMappingRGBA,                           // VkComponentMapping       components;
			{ VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u },  // VkImageSubresourceRange  subresourceRange;
		};

		m_colorAttachmentView[PIPELINE_CACHE_NDX_NO_CACHE] = createImageView(vk, vkDevice, &colorAttachmentViewParams);

		colorAttachmentViewParams.image = *m_colorImage[PIPELINE_CACHE_NDX_CACHED];
		m_colorAttachmentView[PIPELINE_CACHE_NDX_CACHED] = createImageView(vk, vkDevice, &colorAttachmentViewParams);
	}

	// Create depth attachment view
	{
		const VkImageViewCreateInfo depthAttachmentViewParams =
		{
			VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,       // VkStructureType          sType;
			DE_NULL,                                        // const void*              pNext;
			0u,                                             // VkImageViewCreateFlags   flags;
			*m_depthImage,                                  // VkImage                  image;
			VK_IMAGE_VIEW_TYPE_2D,                          // VkImageViewType          viewType;
			m_depthFormat,                                  // VkFormat                 format;
			ComponentMappingRGBA,                           // VkComponentMapping       components;
			{ VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u },  // VkImageSubresourceRange  subresourceRange;
		};

		m_depthAttachmentView = createImageView(vk, vkDevice, &depthAttachmentViewParams);
	}

	// Create framebuffer
	{
		VkImageView attachmentBindInfos[2] =
		{
			*m_colorAttachmentView[PIPELINE_CACHE_NDX_NO_CACHE],
			*m_depthAttachmentView,
		};

		const VkFramebufferCreateInfo framebufferParams =
		{
			VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,          // VkStructureType              sType;
			DE_NULL,                                            // const void*                  pNext;
			0u,                                                 // VkFramebufferCreateFlags     flags;
			*m_renderPass,                                      // VkRenderPass                 renderPass;
			2u,                                                 // deUint32                     attachmentCount;
			attachmentBindInfos,                                // const VkImageView*           pAttachments;
			(deUint32)m_renderSize.x(),                         // deUint32                     width;
			(deUint32)m_renderSize.y(),                         // deUint32                     height;
			1u,                                                 // deUint32                     layers;
		};

		m_framebuffer[PIPELINE_CACHE_NDX_NO_CACHE] = createFramebuffer(vk, vkDevice, &framebufferParams);

		attachmentBindInfos[0] = *m_colorAttachmentView[PIPELINE_CACHE_NDX_CACHED];
		m_framebuffer[PIPELINE_CACHE_NDX_CACHED] = createFramebuffer(vk, vkDevice, &framebufferParams);
	}

	// Bind shader stages
	VkPhysicalDeviceFeatures  features = m_context.getDeviceFeatures();
	for (deUint32 shaderNdx = 0; shaderNdx < m_param->getShaderCount(); shaderNdx++)
	{
		switch(m_param->getShaderFlag(shaderNdx))
		{
			case VK_SHADER_STAGE_VERTEX_BIT:
				m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_VERTEX_BIT, "color_vert", "main");
				break;
			case VK_SHADER_STAGE_FRAGMENT_BIT:
				m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_FRAGMENT_BIT, "color_frag", "main");
				break;
			case VK_SHADER_STAGE_GEOMETRY_BIT:
				if (features.geometryShader == VK_FALSE)
				{
					TCU_THROW(NotSupportedError, "Geometry Shader Not Supported");
				}
				else
				{
					m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_GEOMETRY_BIT, "dummy_geo", "main");
				}
				break;
			case VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT:
				if (features.tessellationShader == VK_FALSE)
				{
					TCU_THROW(NotSupportedError, "Tessellation Not Supported");
				}
				else
				{
					m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT, "basic_tcs", "main");
					m_pipelineBuilder.enableTessellationStage(3);
				}
				break;
			case VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT:
				if (features.tessellationShader == VK_FALSE)
				{
					TCU_THROW(NotSupportedError, "Tessellation Not Supported");
				}
				else
				{
					m_pipelineBuilder.bindShaderStage(VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, "basic_tes", "main");
					m_pipelineBuilder.enableTessellationStage(3);
				}
				break;
			default:
				DE_FATAL("Unknown Shader Stage!");
				break;
		};
	}

	// Create pipeline layout
	{
		const VkPipelineLayoutCreateInfo pipelineLayoutParams =
		{
			VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,		// VkStructureType					sType;
			DE_NULL,											// const void*						pNext;
			0u,													// VkPipelineLayoutCreateFlags		flags;
			0u,													// deUint32							setLayoutCount;
			DE_NULL,											// const VkDescriptorSetLayout*		pSetLayouts;
			0u,													// deUint32							pushConstantRangeCount;
			DE_NULL												// const VkPushConstantRange*		pPushConstantRanges;
		};

		m_pipelineLayout = createPipelineLayout(vk, vkDevice, &pipelineLayoutParams);
	}

	m_pipeline[PIPELINE_CACHE_NDX_NO_CACHE]	= m_pipelineBuilder.buildPipeline(m_renderSize, *m_renderPass, *m_cache, *m_pipelineLayout);
	m_pipeline[PIPELINE_CACHE_NDX_CACHED]	= m_pipelineBuilder.buildPipeline(m_renderSize, *m_renderPass, *m_cache, *m_pipelineLayout);
}